

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_fourier_transform.h
# Opt level: O0

void __thiscall
sptk::DiscreteFourierTransform::~DiscreteFourierTransform(DiscreteFourierTransform *this)

{
  DiscreteFourierTransform *in_RDI;
  
  ~DiscreteFourierTransform(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~DiscreteFourierTransform() {
  }